

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

vector<AEntity_*,_std::allocator<AEntity_*>_> * __thiscall
Api::getBoardPlayer(Api *this,int player,bool verbose)

{
  Player *pPVar1;
  ostream *poVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference ppAVar5;
  undefined1 local_50 [44];
  int i;
  vector<AEntity_*,_std::allocator<AEntity_*>_> *board;
  bool verbose_local;
  Api *pAStack_18;
  int player_local;
  Api *this_local;
  
  board._3_1_ = verbose;
  board._4_4_ = player;
  pAStack_18 = this;
  if (verbose) {
    pPVar1 = GameManager::get_player(&this->_game);
    register0x00000000 = (Api *)Player::get_board(pPVar1 + board._4_4_);
    poVar2 = std::operator<<((ostream *)&std::cout,"Board player ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,board._4_4_);
    poVar2 = std::operator<<(poVar2,": ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_50._36_4_ = 0;
    while( true ) {
      uVar3 = (ulong)(int)local_50._36_4_;
      sVar4 = std::vector<AEntity_*,_std::allocator<AEntity_*>_>::size
                        ((vector<AEntity_*,_std::allocator<AEntity_*>_> *)stack0xffffffffffffffd8);
      if (sVar4 <= uVar3) break;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_50._36_4_);
      poVar2 = std::operator<<(poVar2,": ");
      ppAVar5 = std::vector<AEntity_*,_std::allocator<AEntity_*>_>::operator[]
                          ((vector<AEntity_*,_std::allocator<AEntity_*>_> *)stack0xffffffffffffffd8,
                           (long)(int)local_50._36_4_);
      AEntity::get_reference(*ppAVar5);
      ACard::get_name_abi_cxx11_((ACard *)local_50);
      poVar2 = std::operator<<(poVar2,(string *)local_50);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_50);
      local_50._36_4_ = local_50._36_4_ + 1;
    }
    this_local = stack0xffffffffffffffd8;
  }
  else {
    pPVar1 = GameManager::get_player(&this->_game);
    this_local = (Api *)Player::get_board(pPVar1 + board._4_4_);
  }
  return (vector<AEntity_*,_std::allocator<AEntity_*>_> *)this_local;
}

Assistant:

const std::vector<AEntity *> & Api::getBoardPlayer(int player, bool verbose)
{
    if (verbose){
        const std::vector<AEntity *> &board = this->_game.get_player()[player].get_board();
        std::cout << "Board player " << player << ": " << std::endl;
        for (int i = 0; i < board.size(); i += 1) {
            std::cout << i << ": " << board[i]->get_reference()->get_name() << std::endl;
        }
        return board;
    } else {
        return this->_game.get_player()[player].get_board();
    }
}